

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

text * lest::pluralise(text *__return_storage_ptr__,text *word,int n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if (n == 1) {
    std::__cxx11::string::string((string *)&local_38,(string *)word);
  }
  else {
    std::operator+(&local_58,word,"s");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      local_58._M_dataplus._M_p = (pointer)&local_28;
      local_28._8_8_ = local_58.field_2._8_8_;
    }
    local_28._M_allocated_capacity._1_7_ = local_58.field_2._M_allocated_capacity._1_7_;
    local_28._M_local_buf[0] = local_58.field_2._M_local_buf[0];
    local_30 = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_58._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38 == &local_28) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_28._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = local_30;
  local_30 = 0;
  local_28._M_allocated_capacity = local_28._M_allocated_capacity & 0xffffffffffffff00;
  local_38 = &local_28;
  std::__cxx11::string::~string((string *)&local_38);
  if (n != 1) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

inline text pluralise( text word, int n )
{
    return n == 1 ? word : word + "s";
}